

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_ObjComputeTruthTable6(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp,Vec_Wrd_t *vTruths)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  bool bVar4;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pLeaf;
  Vec_Wrd_t *vTruths_local;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vSupp);
  if (6 < iVar1) {
    __assert_fail("Vec_IntSize(vSupp) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x7c,
                  "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    if ((*(ulong *)pObj >> 0x1e & 1) != 0) {
      __assert_fail("!pObj->fMark0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                    ,0x7e,
                    "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                   );
    }
    Vec_WrdClear(vTruths);
    Gia_ManIncrementTravId(p);
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vSupp);
      bVar4 = false;
      if (local_34 < iVar1) {
        iVar1 = Vec_IntEntry(vSupp,local_34);
        pGStack_30 = Gia_ManObj(p,iVar1);
        bVar4 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      if ((*(ulong *)pGStack_30 >> 0x1e & 1) == 0) {
        iVar1 = Gia_ObjIsRo(p,pGStack_30);
        if (iVar1 == 0) {
          __assert_fail("pLeaf->fMark0 || Gia_ObjIsRo(p, pLeaf)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                        ,0x83,
                        "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                       );
        }
      }
      uVar2 = Vec_WrdSize(vTruths);
      pGStack_30->Value = uVar2;
      Vec_WrdPush(vTruths,s_Truth6[local_34]);
      Gia_ObjSetTravIdCurrent(p,pGStack_30);
      local_34 = local_34 + 1;
    }
    Gia_ObjComputeTruthTable6_rec(p,pObj,vTruths);
    wVar3 = Vec_WrdEntryLast(vTruths);
    return wVar3;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                ,0x7d,
                "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
               );
}

Assistant:

word Gia_ObjComputeTruthTable6( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pLeaf;
    int i;
    assert( Vec_IntSize(vSupp) <= 6 );
    assert( Gia_ObjIsAnd(pObj) );
    assert( !pObj->fMark0 );
    Vec_WrdClear( vTruths );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vSupp, p, pLeaf, i )
    {
        assert( pLeaf->fMark0 || Gia_ObjIsRo(p, pLeaf) );
        pLeaf->Value = Vec_WrdSize(vTruths);
        Vec_WrdPush( vTruths, s_Truth6[i] );
        Gia_ObjSetTravIdCurrent(p, pLeaf);
    }
    Gia_ObjComputeTruthTable6_rec( p, pObj, vTruths );
    return Vec_WrdEntryLast( vTruths );
}